

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O0

Fl_Shared_Image * Fl_Shared_Image::get(char *name,int W,int H)

{
  int iVar1;
  undefined4 extraout_var;
  Fl_Shared_Image *local_28;
  Fl_Shared_Image *temp;
  int H_local;
  int W_local;
  char *name_local;
  
  name_local = (char *)find(name,W,H);
  if ((Fl_Shared_Image *)name_local == (Fl_Shared_Image *)0x0) {
    local_28 = find(name,0,0);
    if (local_28 == (Fl_Shared_Image *)0x0) {
      local_28 = (Fl_Shared_Image *)operator_new(0x48);
      Fl_Shared_Image(local_28,name,(Fl_Image *)0x0);
      if (local_28->image_ == (Fl_Image *)0x0) {
        if (local_28 != (Fl_Shared_Image *)0x0) {
          (*(local_28->super_Fl_Image)._vptr_Fl_Image[1])();
        }
        return (Fl_Shared_Image *)0x0;
      }
      add(local_28);
    }
    iVar1 = Fl_Image::w(&local_28->super_Fl_Image);
    if ((((iVar1 != W) || (iVar1 = Fl_Image::h(&local_28->super_Fl_Image), iVar1 != H)) && (W != 0))
       && (H != 0)) {
      iVar1 = (*(local_28->super_Fl_Image)._vptr_Fl_Image[2])
                        (local_28,(ulong)(uint)W,(ulong)(uint)H);
      local_28 = (Fl_Shared_Image *)CONCAT44(extraout_var,iVar1);
      add(local_28);
    }
    name_local = (char *)local_28;
  }
  return (Fl_Shared_Image *)name_local;
}

Assistant:

Fl_Shared_Image* Fl_Shared_Image::get(const char *name, int W, int H) {
  Fl_Shared_Image	*temp;		// Image

  if ((temp = find(name, W, H)) != NULL) return temp;

  if ((temp = find(name)) == NULL) {
    temp = new Fl_Shared_Image(name);

    if (!temp->image_) {
      delete temp;
      return NULL;
    }

    temp->add();
  }

  if ((temp->w() != W || temp->h() != H) && W && H) {
    temp = (Fl_Shared_Image *)temp->copy(W, H);
    temp->add();
  }

  return temp;
}